

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_iter.cpp
# Opt level: O0

bool __thiscall ON_SubDSectorIterator::IsValid(ON_SubDSectorIterator *this)

{
  ON_SubDVertex *pOVar1;
  ON_SubDVertex *pOVar2;
  ON_SubDEdge *pOVar3;
  ON_SubDEdge *pOVar4;
  ON_SubDEdgePtr OVar5;
  ON_SubDEdgePtr OVar6;
  ON_SubDEdgePtr feptr [2];
  ON_SubDEdge *edge [2];
  ON_SubDSectorIterator *this_local;
  
  if ((this->m_center_vertex == (ON_SubDVertex *)0x0) &&
     (this->m_initial_face == (ON_SubDFace *)0x0)) {
    this_local._7_1_ = true;
  }
  else if ((this->m_center_vertex == (ON_SubDVertex *)0x0) ||
          (this->m_initial_face == (ON_SubDFace *)0x0)) {
    ON_SubDIncrementErrorCount();
    this_local._7_1_ = false;
  }
  else {
    pOVar1 = this->m_center_vertex;
    pOVar2 = ON_SubDFace::Vertex(this->m_initial_face,this->m_initial_fvi);
    if (pOVar1 == pOVar2) {
      if (this->m_current_face == (ON_SubDFace *)0x0) {
        this_local._7_1_ = true;
      }
      else {
        pOVar1 = this->m_center_vertex;
        pOVar2 = ON_SubDFace::Vertex(this->m_current_face,this->m_current_fvi);
        if (pOVar1 == pOVar2) {
          pOVar3 = ON_SubDEdgePtr::Edge(this->m_current_eptr);
          pOVar4 = ON_SubDEdgePtr::Edge(this->m_current_eptr + 1);
          if ((pOVar3 == (ON_SubDEdge *)0x0) || (pOVar4 == (ON_SubDEdge *)0x0)) {
            ON_SubDIncrementErrorCount();
            this_local._7_1_ = false;
          }
          else if (this->m_center_vertex == pOVar3->m_vertex[this->m_current_eptr[0].m_ptr & 1]) {
            if (this->m_center_vertex == pOVar4->m_vertex[this->m_current_eptr[1].m_ptr & 1]) {
              OVar5 = ON_SubDFace::EdgePtr(this->m_current_face,this->m_current_fei[0]);
              OVar6 = ON_SubDFace::EdgePtr(this->m_current_face,this->m_current_fei[1]);
              if (pOVar3 == (ON_SubDEdge *)(OVar5.m_ptr & 0xfffffffffffffff8)) {
                if (pOVar4 == (ON_SubDEdge *)(OVar6.m_ptr & 0xfffffffffffffff8)) {
                  this_local._7_1_ = true;
                }
                else {
                  ON_SubDIncrementErrorCount();
                  this_local._7_1_ = false;
                }
              }
              else {
                ON_SubDIncrementErrorCount();
                this_local._7_1_ = false;
              }
            }
            else {
              ON_SubDIncrementErrorCount();
              this_local._7_1_ = false;
            }
          }
          else {
            ON_SubDIncrementErrorCount();
            this_local._7_1_ = false;
          }
        }
        else {
          ON_SubDIncrementErrorCount();
          this_local._7_1_ = false;
        }
      }
    }
    else {
      ON_SubDIncrementErrorCount();
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SubDSectorIterator::IsValid() const
{
  if (nullptr == m_center_vertex && nullptr == m_initial_face)
    return true;

  if (nullptr == m_center_vertex || nullptr == m_initial_face)
    return ON_SUBD_RETURN_ERROR(false);

  if ( m_center_vertex != m_initial_face->Vertex(m_initial_fvi) )
    return ON_SUBD_RETURN_ERROR(false);

  if (nullptr == m_current_face)
    return true; // finished iterating

  if (m_center_vertex != m_current_face->Vertex(m_current_fvi))
    return ON_SUBD_RETURN_ERROR(false);

  const ON_SubDEdge* edge[2] = { m_current_eptr[0].Edge(), m_current_eptr[1].Edge() };
  if (nullptr == edge[0] || nullptr == edge[1])
    return ON_SUBD_RETURN_ERROR(false);
  if (m_center_vertex != edge[0]->m_vertex[ON_SUBD_EDGE_DIRECTION(m_current_eptr[0].m_ptr)])
    return ON_SUBD_RETURN_ERROR(false);
  if (m_center_vertex != edge[1]->m_vertex[ON_SUBD_EDGE_DIRECTION(m_current_eptr[1].m_ptr)])
    return ON_SUBD_RETURN_ERROR(false);

  const ON_SubDEdgePtr feptr[2] = { m_current_face->EdgePtr(m_current_fei[0]), m_current_face->EdgePtr(m_current_fei[1]) };
  
  if (edge[0] != ON_SUBD_EDGE_POINTER(feptr[0].m_ptr))
    return ON_SUBD_RETURN_ERROR(false);

  if (edge[1] != ON_SUBD_EDGE_POINTER(feptr[1].m_ptr))
    return ON_SUBD_RETURN_ERROR(false);

  return true;
}